

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::forStatement(Parser *this)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  ptr<StatementBlock> statBlock;
  Identifier identifier;
  ptr<Expression> iterable;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  _Alloc_hider local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_20;
  
  consume(in_RSI);
  Token::Token((Token *)&iterable,&in_RSI->currentToken);
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iterable.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      local_48) {
    identifier.field_2._8_8_ = local_48[0]._8_8_;
  }
  else {
    identifier._M_dataplus._M_p =
         (pointer)iterable.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
  }
  local_48[0]._M_local_buf[0] = '\0';
  iterable.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  std::__cxx11::string::~string
            ((string *)
             &iterable.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  consume(in_RSI,Identifier,"identifier");
  consume(in_RSI,In,"\'in\'");
  expression((Parser *)&iterable);
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)&statBlock);
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  std::
  make_shared<ForStatement,std::__cxx11::string&,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (shared_ptr<Expression> *)&identifier,(shared_ptr<StatementBlock> *)&iterable);
  uVar1 = aStack_20._M_allocated_capacity;
  aStack_20._M_allocated_capacity = 0;
  (this->filepath)._M_dataplus._M_p = local_28._M_p;
  (this->filepath)._M_string_length = uVar1;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_20._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iterable.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&identifier);
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::forStatement() {
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::In, "'in'");

    ptr<Expression> iterable = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<ForStatement>(identifier, iterable, statBlock);
}